

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O2

bool __thiscall QDialogButtonBox::event(QDialogButtonBox *this,QEvent *event)

{
  bool bVar1;
  
  if (*(short *)(event + 8) == 0x59) {
    QDialogButtonBoxPrivate::retranslateStrings(*(QDialogButtonBoxPrivate **)(this + 8));
  }
  else if (*(short *)(event + 8) == 0x11) {
    QDialogButtonBoxPrivate::ensureFirstAcceptIsDefault(*(QDialogButtonBoxPrivate **)(this + 8));
  }
  bVar1 = QWidget::event((QWidget *)this,event);
  return bVar1;
}

Assistant:

bool QDialogButtonBox::event(QEvent *event)
{
    Q_D(QDialogButtonBox);
    switch (event->type()) {
    case QEvent::Show:
        d->ensureFirstAcceptIsDefault();
        break;

    case QEvent::LanguageChange:
        d->retranslateStrings();
        break;

    default: break;
    }

    return QWidget::event(event);
}